

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O3

Var Js::JavascriptSet::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  ThreadContext *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var aValue;
  RecyclableObject *pRVar7;
  Var pvVar8;
  RecyclableObject *this_01;
  RecyclableObject *nextFunc;
  JavascriptMethod p_Var9;
  int in_stack_00000010;
  Arguments local_b0;
  undefined1 local_a0 [8];
  AutoTagNativeLibraryEntry __tag;
  ArgumentReader args;
  Var local_58;
  CallInfo local_50;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_50 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x1e,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d0ad36;
    *puVar6 = 0;
  }
  __tag.entry.next = (Entry *)callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&__tag.entry.next,&local_50);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_a0,function,local_50,L"Set",&stack0x00000000);
  aValue = CallInfo::GetNewTarget
                     ((uint)__tag.entry.next >> 0x18,(Var *)&stack0x00000018,
                      (uint)__tag.entry.next & 0xffffff);
  local_b0.Info = (Type)__tag.entry.next;
  local_b0.Values = (Type)&stack0x00000018;
  bVar3 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_b0);
  if (((ulong)local_50 & 0x1000000) == 0) {
    JavascriptError::ThrowTypeErrorVar(pSVar1,-0x7ff5ec04,L"Set");
  }
  callInfo_local = (CallInfo)JavascriptLibrary::CreateSet(this);
  if (callInfo_local == (CallInfo)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x31,"(setObject != nullptr)","setObject != nullptr");
    if (!bVar4) goto LAB_00d0ad36;
    *puVar6 = 0;
  }
  if (((ulong)__tag.entry.next & 0xfffffe) == 0) {
    pRVar7 = (this->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    pRVar7 = (RecyclableObject *)Arguments::operator[]((Arguments *)&__tag.entry.next,1);
  }
  if (*(char *)((long)callInfo_local + 0x38) == '\0') {
    BVar5 = JavascriptConversion::CheckObjectCoercible(pRVar7,pSVar1);
    if (BVar5 != 0) {
      pRVar7 = JavascriptOperators::GetIterator(pRVar7,pSVar1,false);
      pvVar8 = JavascriptOperators::GetPropertyNoCache
                         ((RecyclableObject *)callInfo_local,0x4a,pSVar1);
      bVar4 = JavascriptConversion::IsCallable(pvVar8);
      if (!bVar4) {
        JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec76,(PCWSTR)0x0);
      }
      this_01 = VarTo<Js::RecyclableObject>(pvVar8);
      if (pRVar7 != (RecyclableObject *)0x0) {
        local_58 = (Var)0x0;
        nextFunc = JavascriptOperators::CacheIteratorNext(pRVar7,pSVar1);
        while( true ) {
          bVar4 = JavascriptOperators::IteratorStepAndValue(pRVar7,pSVar1,nextFunc,&local_58);
          pvVar8 = local_58;
          if (!bVar4) break;
          this_00 = pSVar1->threadContext;
          bVar4 = this_00->reentrancySafeOrHandled;
          this_00->reentrancySafeOrHandled = true;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
          if (pSVar1->threadContext->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var9 = RecyclableObject::GetEntryPoint(this_01);
          CheckIsExecutable(this_01,p_Var9);
          p_Var9 = RecyclableObject::GetEntryPoint(this_01);
          (*p_Var9)(this_01,(CallInfo)this_01,0x2000002,0,0,0,0,0x2000002,callInfo_local,pvVar8);
          this_00->reentrancySafeOrHandled = bVar4;
        }
      }
    }
    if (bVar3) {
      pRVar7 = VarTo<Js::RecyclableObject>(aValue);
      callInfo_local =
           (CallInfo)
           JavascriptOperators::OrdinaryCreateFromConstructor
                     (pRVar7,(RecyclableObject *)callInfo_local,(DynamicObject *)0x0,pSVar1);
    }
    AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_a0);
    return (Var)callInfo_local;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar6 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                              ,0x38,"((0))","UNREACHED");
  if (bVar3) {
    *puVar6 = 0;
    JavascriptError::ThrowTypeErrorVar(pSVar1,-0x7ff5ec06,L"Set");
  }
LAB_00d0ad36:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

Var JavascriptSet::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    JavascriptLibrary* library = scriptContext->GetLibrary();
    AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Set"));

    Var newTarget = args.GetNewTarget();
    bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);
    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Set, scriptContext);

    JavascriptSet* setObject = nullptr;

    if (callInfo.Flags & CallFlags_New)
    {
        setObject = library->CreateSet();
    }
    else
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Set"), _u("Set"));
    }
    Assert(setObject != nullptr);

    Var iterable = (args.Info.Count > 1) ? args[1] : library->GetUndefined();

    // REVIEW: This condition seems impossible?
    if (setObject->kind != SetKind::EmptySet)
    {
        Assert(UNREACHED);
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_ObjectIsAlreadyInitialized, _u("Set"), _u("Set"));
    }

    RecyclableObject* iter = nullptr;
    RecyclableObject* adder = nullptr;

    if (JavascriptConversion::CheckObjectCoercible(iterable, scriptContext))
    {
        iter = JavascriptOperators::GetIterator(iterable, scriptContext);
        Var adderVar = JavascriptOperators::GetPropertyNoCache(setObject, PropertyIds::add, scriptContext);
        if (!JavascriptConversion::IsCallable(adderVar))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
        }
        adder = VarTo<RecyclableObject>(adderVar);
    }

    if (iter != nullptr)
    {
        JavascriptOperators::DoIteratorStepAndValue(iter, scriptContext, [&](Var nextItem) {
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                CALL_FUNCTION(scriptContext->GetThreadContext(), adder, CallInfo(CallFlags_Value, 2), setObject, nextItem);
            }
            END_SAFE_REENTRANT_CALL
        });
    }

    return isCtorSuperCall ?
        JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), setObject, nullptr, scriptContext) :
        setObject;
}